

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sexp_conflict
sexp_copy_lambda(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict lambda)

{
  sexp_conflict psVar1;
  
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x60,0x1c);
  (psVar1->value).flonum = (lambda->value).flonum;
  (psVar1->value).type.cpl = (lambda->value).type.cpl;
  (psVar1->value).type.slots = (lambda->value).type.slots;
  (psVar1->value).type.setters = (lambda->value).type.setters;
  (psVar1->value).type.print = (lambda->value).type.print;
  (psVar1->value).type.dl = (lambda->value).type.dl;
  (psVar1->value).type.getters = (lambda->value).type.getters;
  (psVar1->value).type.finalize_name = (lambda->value).type.finalize_name;
  (psVar1->value).port.size = (lambda->value).port.size;
  return psVar1;
}

Assistant:

sexp sexp_copy_lambda (sexp ctx, sexp self, sexp_sint_t n, sexp lambda) {
  sexp res = sexp_alloc_type(ctx, lambda, SEXP_LAMBDA);
  sexp_lambda_name(res) = sexp_lambda_name(lambda);
  sexp_lambda_params(res) = sexp_lambda_params(lambda);
  sexp_lambda_body(res) = sexp_lambda_body(lambda);
  sexp_lambda_locals(res) = sexp_lambda_locals(lambda);
  sexp_lambda_fv(res) = sexp_lambda_fv(lambda);
  sexp_lambda_sv(res) = sexp_lambda_sv(lambda);
  sexp_lambda_defs(res) = sexp_lambda_defs(lambda);
  sexp_lambda_return_type(res) = sexp_lambda_return_type(lambda);
  sexp_lambda_param_types(res) = sexp_lambda_param_types(lambda);
  return res;
}